

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O3

bool __thiscall
qclab::QCircuit<double,_qclab::QObject<double>_>::canInsert
          (QCircuit<double,_qclab::QObject<double>_> *this,gate_type *gate)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> qubits;
  int *local_30;
  int *local_28;
  long local_20;
  
  (*gate->_vptr_QObject[5])(&local_30);
  piVar2 = local_30 + 1;
  piVar3 = local_30;
  if (piVar2 != local_28 && local_30 != local_28) {
    iVar4 = *local_30;
    do {
      iVar1 = *piVar2;
      iVar5 = iVar4;
      if (iVar4 <= iVar1) {
        iVar5 = iVar1;
      }
      if (iVar4 < iVar1) {
        piVar3 = piVar2;
      }
      piVar2 = piVar2 + 1;
      iVar4 = iVar5;
    } while (piVar2 != local_28);
  }
  iVar4 = *piVar3;
  iVar1 = this->nbQubits_;
  if (local_30 != (int *)0x0) {
    operator_delete(local_30,local_20 - (long)local_30);
  }
  return iVar4 < iVar1;
}

Assistant:

bool canInsert( const gate_type& gate ) const {
        const auto qubits = gate.qubits() ;
        if ( *std::max_element( qubits.begin() , qubits.end() ) >= nbQubits_ ) {
          return false ;
        }
        return true ;
      }